

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_decode(lzh_stream *strm,wchar_t last)

{
  wchar_t wVar1;
  lzh_dec *plVar2;
  wchar_t local_30;
  wchar_t r;
  wchar_t avail_in;
  lzh_dec *ds;
  wchar_t last_local;
  lzh_stream *strm_local;
  
  plVar2 = strm->ds;
  if (plVar2->error == L'\0') {
    wVar1 = strm->avail_in;
    do {
      if (plVar2->state < L'\t') {
        local_30 = lzh_read_blocks(strm,last);
      }
      else {
        local_30 = lzh_decode_blocks(strm,last);
      }
    } while (local_30 == L'd');
    strm->total_in = (long)(wVar1 - strm->avail_in) + strm->total_in;
    strm_local._4_4_ = local_30;
  }
  else {
    strm_local._4_4_ = plVar2->error;
  }
  return strm_local._4_4_;
}

Assistant:

static int
lzh_decode(struct lzh_stream *strm, int last)
{
	struct lzh_dec *ds = strm->ds;
	int avail_in;
	int r;

	if (ds->error)
		return (ds->error);

	avail_in = strm->avail_in;
	do {
		if (ds->state < ST_GET_LITERAL)
			r = lzh_read_blocks(strm, last);
		else
			r = lzh_decode_blocks(strm, last);
	} while (r == 100);
	strm->total_in += avail_in - strm->avail_in;
	return (r);
}